

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

void __thiscall
leveldb::Version::LevelFileNumIterator::LevelFileNumIterator
          (LevelFileNumIterator *this,InternalKeyComparator *icmp,
          vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *flist)

{
  Iterator::Iterator(&this->super_Iterator);
  (this->super_Iterator)._vptr_Iterator = (_func_int **)&PTR__LevelFileNumIterator_0016b878;
  (this->icmp_).super_Comparator._vptr_Comparator = (_func_int **)&PTR__Comparator_0016b770;
  (this->icmp_).user_comparator_ = icmp->user_comparator_;
  this->flist_ = flist;
  this->index_ = (uint32_t)
                 ((ulong)((long)(flist->
                                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(flist->
                               super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                               )._M_impl.super__Vector_impl_data._M_start) >> 3);
  return;
}

Assistant:

LevelFileNumIterator(const InternalKeyComparator& icmp,
                       const std::vector<FileMetaData*>* flist)
      : icmp_(icmp), flist_(flist), index_(flist->size()) {  // Marks as invalid
  }